

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Ray * __thiscall pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Ray *r,Float *tMax)

{
  long in_RDX;
  long in_RSI;
  Ray *in_RDI;
  Transform t;
  Float in_stack_0000028c;
  AnimatedTransform *in_stack_00000290;
  
  if (((*(byte *)(in_RSI + 0x108) & 1) == 0) ||
     (*(float *)(in_RDX + 0x18) <= *(float *)(in_RSI + 0x100))) {
    Transform::operator()((Transform *)t.m.m[2]._0_8_,(Ray *)t.m.m[1]._8_8_,(Float *)t.m.m[1]._0_8_)
    ;
  }
  else if (*(float *)(in_RDX + 0x18) < *(float *)(in_RSI + 0x104)) {
    Interpolate(in_stack_00000290,in_stack_0000028c);
    Transform::operator()((Transform *)t.m.m[2]._0_8_,(Ray *)t.m.m[1]._8_8_,(Float *)t.m.m[1]._0_8_)
    ;
  }
  else {
    Transform::operator()((Transform *)t.m.m[2]._0_8_,(Ray *)t.m.m[1]._8_8_,(Float *)t.m.m[1]._0_8_)
    ;
  }
  return in_RDI;
}

Assistant:

Ray AnimatedTransform::operator()(const Ray &r, Float *tMax) const {
    if (!actuallyAnimated || r.time <= startTime)
        return startTransform(r, tMax);
    else if (r.time >= endTime)
        return endTransform(r, tMax);
    else {
        Transform t = Interpolate(r.time);
        return t(r, tMax);
    }
}